

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O2

size_t __thiscall
Assimp::MemoryIOStream::Read(MemoryIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  uint __line;
  ulong uVar1;
  char *__assertion;
  
  if (pvBuffer == (void *)0x0) {
    __assertion = "nullptr != pvBuffer";
    __line = 0x56;
  }
  else {
    if (pSize != 0) {
      uVar1 = (this->length - this->pos) / pSize;
      if (pCount <= uVar1) {
        uVar1 = pCount;
      }
      memcpy(pvBuffer,this->buffer + this->pos,pSize * uVar1);
      this->pos = this->pos + pSize * uVar1;
      return uVar1;
    }
    __assertion = "0 != pSize";
    __line = 0x57;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/MemoryIOWrapper.h"
                ,__line,"virtual size_t Assimp::MemoryIOStream::Read(void *, size_t, size_t)");
}

Assistant:

size_t Read(void* pvBuffer, size_t pSize, size_t pCount)    {
        ai_assert(nullptr != pvBuffer);
        ai_assert(0 != pSize);
        
        const size_t cnt = std::min( pCount, (length-pos) / pSize);
        const size_t ofs = pSize * cnt;

        ::memcpy(pvBuffer,buffer+pos,ofs);
        pos += ofs;

        return cnt;
    }